

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcPerform(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  abctime aVar2;
  long local_30;
  abctime TimeToStop;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if (pPars->nTimeOut == 0) {
    local_30 = 0;
  }
  else {
    iVar1 = pPars->nTimeOut;
    aVar2 = Abc_Clock();
    local_30 = (long)iVar1 * 1000000 + aVar2;
  }
  if (pPars->nFramesAdd == 0) {
    pGia_local._4_4_ = Gia_ManBmcPerformInt(pGia,pPars);
  }
  else {
    if (pPars->nTimeOut < 0) {
      __assert_fail("pPars->nTimeOut >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0x430,"int Gia_ManBmcPerform(Gia_Man_t *, Bmc_AndPar_t *)");
    }
    while( true ) {
      if ((local_30 != 0) && (aVar2 = Abc_Clock(), local_30 < aVar2)) {
        return -1;
      }
      iVar1 = Gia_ManBmcPerformInt(pGia,pPars);
      if (iVar1 == 0) {
        return 0;
      }
      if (pPars->nTimeOut == 0) {
        return -1;
      }
      iVar1 = pPars->nTimeOut;
      aVar2 = Abc_Clock();
      iVar1 = Abc_MinInt(iVar1 + -1,(int)((local_30 - aVar2) / 1000000));
      pPars->nTimeOut = iVar1;
      if (pPars->nTimeOut < 1) break;
      pPars->nFramesAdd = pPars->nFramesAdd << 1;
    }
    pGia_local._4_4_ = -1;
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ManBmcPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime TimeToStop = pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( pPars->nFramesAdd == 0 )
        return Gia_ManBmcPerformInt( pGia, pPars );
    // iterate over the engine until we read the global timeout
    assert( pPars->nTimeOut >= 0 );
    while ( 1 )
    {
        if ( TimeToStop && TimeToStop < Abc_Clock() )
            return -1;
        if ( Gia_ManBmcPerformInt( pGia, pPars ) == 0 )
            return 0;
        // set the new runtime limit
        if ( pPars->nTimeOut )
        {
            pPars->nTimeOut = Abc_MinInt( pPars->nTimeOut-1, (int)((TimeToStop - Abc_Clock()) / CLOCKS_PER_SEC) );
            if ( pPars->nTimeOut <= 0 )
                return -1;
        }
        else
            return -1;
        // set the new frames limit
        pPars->nFramesAdd *= 2;
    }
    return -1;
}